

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall QDomDocumentPrivate::QDomDocumentPrivate(QDomDocumentPrivate *this)

{
  long lVar1;
  QDomNodePrivate *parent;
  QDomDocumentPrivate *doc;
  char16_t *in_RDI;
  long in_FS_OFFSET;
  QDomDocumentTypePrivate *o;
  QDomNodePrivate *in_stack_ffffffffffffffb0;
  QDomDocumentPrivate *in_stack_ffffffffffffffb8;
  QDomNodePrivate *in_stack_ffffffffffffffc0;
  QDomDocumentTypePrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDomNodePrivate::QDomNodePrivate
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *(undefined ***)in_RDI = &PTR__QDomDocumentPrivate_00146530;
  o = (QDomDocumentTypePrivate *)(in_RDI + 0x54);
  parent = (QDomNodePrivate *)operator_new(4);
  QDomImplementationPrivate::QDomImplementationPrivate((QDomImplementationPrivate *)0x11a3c1);
  QExplicitlySharedDataPointer<QDomImplementationPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QDomImplementationPrivate> *)parent,
             (QDomImplementationPrivate *)o);
  this_00 = (QDomDocumentTypePrivate *)(in_RDI + 0x58);
  QExplicitlySharedDataPointer<QDomDocumentTypePrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QDomDocumentTypePrivate> *)0x11a3e5);
  in_RDI[0x5c] = L'\x01';
  in_RDI[0x5d] = L'\0';
  in_RDI[0x5e] = L'\0';
  in_RDI[0x5f] = L'\0';
  doc = (QDomDocumentPrivate *)operator_new(0x100);
  QDomDocumentTypePrivate::QDomDocumentTypePrivate(this_00,doc,parent);
  QExplicitlySharedDataPointer<QDomDocumentTypePrivate>::operator=
            ((QExplicitlySharedDataPointer<QDomDocumentTypePrivate> *)parent,o);
  QExplicitlySharedDataPointer<QDomDocumentTypePrivate>::operator->
            ((QExplicitlySharedDataPointer<QDomDocumentTypePrivate> *)0x11a42d);
  QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x11a439);
  Qt::Literals::StringLiterals::operator____s(in_RDI,(size_t)this_00);
  QString::operator=((QString *)parent,(QString *)o);
  QString::~QString((QString *)0x11a471);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDomDocumentPrivate::QDomDocumentPrivate()
    : QDomNodePrivate(nullptr),
      impl(new QDomImplementationPrivate),
      nodeListTime(1)
{
    type = new QDomDocumentTypePrivate(this, this);
    type->ref.deref();

    name = u"#document"_s;
}